

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encodemv.c
# Opt level: O2

void av1_update_mv_stats(MV *mv,MV *ref,nmv_context *mvctx,MvSubpelPrecision precision)

{
  short sVar1;
  short sVar2;
  short sVar3;
  short sVar4;
  short sVar5;
  
  sVar1 = mv->row;
  sVar2 = mv->col;
  sVar3 = ref->row;
  sVar4 = ref->col;
  sVar5 = sVar2 - sVar4;
  update_cdf(mvctx->joints_cdf,(sVar1 != sVar3) * '\x02' | sVar5 != 0,4);
  if (sVar1 != sVar3) {
    update_mv_component_stats((int)(short)(sVar1 - sVar3),mvctx->comps,precision);
  }
  if (sVar2 != sVar4) {
    update_mv_component_stats((int)sVar5,mvctx->comps + 1,precision);
    return;
  }
  return;
}

Assistant:

void av1_update_mv_stats(const MV *mv, const MV *ref, nmv_context *mvctx,
                         MvSubpelPrecision precision) {
  const MV diff = { mv->row - ref->row, mv->col - ref->col };
  const MV_JOINT_TYPE j = av1_get_mv_joint(&diff);

  update_cdf(mvctx->joints_cdf, j, MV_JOINTS);

  if (mv_joint_vertical(j))
    update_mv_component_stats(diff.row, &mvctx->comps[0], precision);

  if (mv_joint_horizontal(j))
    update_mv_component_stats(diff.col, &mvctx->comps[1], precision);
}